

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::TestSpecParser::endMode(TestSpecParser *this)

{
  Mode MVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined1 uStack_59;
  NamePattern *pNStack_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  shared_ptr<Catch::TestSpec::Pattern> sStack_40;
  string sStack_30;
  
  MVar1 = this->m_mode;
  if (MVar1 - Name < 2) {
    preprocessPattern_abi_cxx11_(&sStack_30,this);
    if (sStack_30._M_string_length != 0) {
      pNStack_58 = (NamePattern *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Catch::TestSpec::NamePattern,std::allocator<Catch::TestSpec::NamePattern>,std::__cxx11::string&,std::__cxx11::string&>
                (a_Stack_50,&pNStack_58,(allocator<Catch::TestSpec::NamePattern> *)&uStack_59,
                 &sStack_30,&this->m_substring);
      sStack_40.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &pNStack_58->super_Pattern;
      sStack_40.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = a_Stack_50[0]._M_pi;
      if (this->m_exclusion == true) {
        pNStack_58 = (NamePattern *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<Catch::TestSpec::ExcludedPattern,std::allocator<Catch::TestSpec::ExcludedPattern>,std::shared_ptr<Catch::TestSpec::Pattern>&>
                  (a_Stack_50,(ExcludedPattern **)&pNStack_58,
                   (allocator<Catch::TestSpec::ExcludedPattern> *)&uStack_59,&sStack_40);
        _Var2._M_pi = sStack_40.
                      super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        sStack_40.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = a_Stack_50[0]._M_pi;
        sStack_40.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             &pNStack_58->super_Pattern;
        pNStack_58 = (NamePattern *)0x0;
        a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
        }
        if (a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
        }
      }
      clara::std::
      vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
      ::push_back(&(this->m_currentFilter).m_patterns,&sStack_40);
      if (sStack_40.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (sStack_40.
                   super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    (this->m_substring)._M_string_length = 0;
    *(this->m_substring)._M_dataplus._M_p = '\0';
    this->m_exclusion = false;
    this->m_mode = None;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_30._M_dataplus._M_p != &sStack_30.field_2) {
      operator_delete(sStack_30._M_dataplus._M_p,sStack_30.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  if (MVar1 != Tag) {
    if (MVar1 == EscapedName) {
      this->m_mode = this->lastMode;
      return;
    }
    this->m_mode = None;
    return;
  }
  preprocessPattern_abi_cxx11_(&sStack_30,this);
  if (sStack_30._M_string_length != 0) {
    if ((sStack_30._M_string_length != 1) && (*sStack_30._M_dataplus._M_p == '.')) {
      std::__cxx11::string::_M_erase((ulong)&sStack_30,0);
      pNStack_58 = (NamePattern *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Catch::TestSpec::TagPattern,std::allocator<Catch::TestSpec::TagPattern>,char_const(&)[2],std::__cxx11::string&>
                (a_Stack_50,(TagPattern **)&pNStack_58,
                 (allocator<Catch::TestSpec::TagPattern> *)&uStack_59,(char (*) [2])0x17a083,
                 &this->m_substring);
      sStack_40.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &pNStack_58->super_Pattern;
      sStack_40.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = a_Stack_50[0]._M_pi;
      if (this->m_exclusion == true) {
        pNStack_58 = (NamePattern *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<Catch::TestSpec::ExcludedPattern,std::allocator<Catch::TestSpec::ExcludedPattern>,std::shared_ptr<Catch::TestSpec::Pattern>&>
                  (a_Stack_50,(ExcludedPattern **)&pNStack_58,
                   (allocator<Catch::TestSpec::ExcludedPattern> *)&uStack_59,&sStack_40);
        _Var2._M_pi = sStack_40.
                      super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        sStack_40.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = a_Stack_50[0]._M_pi;
        sStack_40.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             &pNStack_58->super_Pattern;
        pNStack_58 = (NamePattern *)0x0;
        a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
        }
        if (a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
        }
      }
      clara::std::
      vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
      ::push_back(&(this->m_currentFilter).m_patterns,&sStack_40);
      if (sStack_40.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (sStack_40.
                   super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    pNStack_58 = (NamePattern *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Catch::TestSpec::TagPattern,std::allocator<Catch::TestSpec::TagPattern>,std::__cxx11::string&,std::__cxx11::string&>
              (a_Stack_50,(TagPattern **)&pNStack_58,
               (allocator<Catch::TestSpec::TagPattern> *)&uStack_59,&sStack_30,&this->m_substring);
    sStack_40.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &pNStack_58->super_Pattern;
    sStack_40.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = a_Stack_50[0]._M_pi;
    if (this->m_exclusion == true) {
      pNStack_58 = (NamePattern *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Catch::TestSpec::ExcludedPattern,std::allocator<Catch::TestSpec::ExcludedPattern>,std::shared_ptr<Catch::TestSpec::Pattern>&>
                (a_Stack_50,(ExcludedPattern **)&pNStack_58,
                 (allocator<Catch::TestSpec::ExcludedPattern> *)&uStack_59,&sStack_40);
      _Var2._M_pi = sStack_40.
                    super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      sStack_40.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = a_Stack_50[0]._M_pi;
      sStack_40.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &pNStack_58->super_Pattern;
      pNStack_58 = (NamePattern *)0x0;
      a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
      }
      if (a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
      }
    }
    clara::std::
    vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
    ::push_back(&(this->m_currentFilter).m_patterns,&sStack_40);
    if (sStack_40.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (sStack_40.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  (this->m_substring)._M_string_length = 0;
  *(this->m_substring)._M_dataplus._M_p = '\0';
  this->m_exclusion = false;
  this->m_mode = None;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_30._M_dataplus._M_p != &sStack_30.field_2) {
    operator_delete(sStack_30._M_dataplus._M_p,sStack_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TestSpecParser::endMode() {
        switch( m_mode ) {
        case Name:
        case QuotedName:
            return addNamePattern();
        case Tag:
            return addTagPattern();
        case EscapedName:
            revertBackToLastMode();
            return;
        case None:
        default:
            return startNewMode( None );
        }
    }